

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O0

uint ZSTD_getLongOffsetsShare(ZSTD_seqSymbol *offTable)

{
  byte bVar1;
  int local_34;
  uint local_30;
  U32 total;
  U32 u;
  U32 max;
  ZSTD_seqSymbol *table;
  U32 tableLog;
  void *ptr;
  ZSTD_seqSymbol *offTable_local;
  
  bVar1 = (byte)offTable->baseValue;
  local_34 = 0;
  for (local_30 = 0; local_30 < (uint)(1 << (bVar1 & 0x1f)); local_30 = local_30 + 1) {
    if (0x16 < offTable[(ulong)local_30 + 1].nbAdditionalBits) {
      local_34 = local_34 + 1;
    }
  }
  return local_34 << (8 - bVar1 & 0x1f);
}

Assistant:

static unsigned
ZSTD_getLongOffsetsShare(const ZSTD_seqSymbol* offTable)
{
    const void* ptr = offTable;
    U32 const tableLog = ((const ZSTD_seqSymbol_header*)ptr)[0].tableLog;
    const ZSTD_seqSymbol* table = offTable + 1;
    U32 const max = 1 << tableLog;
    U32 u, total = 0;
    DEBUGLOG(5, "ZSTD_getLongOffsetsShare: (tableLog=%u)", tableLog);

    assert(max <= (1 << OffFSELog));  /* max not too large */
    for (u=0; u<max; u++) {
        if (table[u].nbAdditionalBits > 22) total += 1;
    }

    assert(tableLog <= OffFSELog);
    total <<= (OffFSELog - tableLog);  /* scale to OffFSELog */

    return total;
}